

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O3

void __thiscall EnvmapImage::resize(EnvmapImage *this,Envmap type,Box2i *dataWindow)

{
  Vec2<int> VVar1;
  Rgba *pRVar2;
  int iVar3;
  int iVar4;
  int local_38;
  int iStack_34;
  
  VVar1 = dataWindow->max;
  iVar3 = (dataWindow->min).x;
  iVar4 = (dataWindow->min).y;
  pRVar2 = (this->_pixels)._data;
  if (pRVar2 != (Rgba *)0x0) {
    operator_delete__(pRVar2);
  }
  (this->_pixels)._sizeX = 0;
  (this->_pixels)._sizeY = 0;
  (this->_pixels)._data = (Rgba *)0x0;
  local_38 = VVar1.x;
  iStack_34 = VVar1.y;
  iVar3 = (local_38 - iVar3) + 1;
  iVar4 = (iStack_34 - iVar4) + 1;
  pRVar2 = (Rgba *)operator_new__(-(ulong)((ulong)((long)iVar4 * (long)iVar3) >> 0x3d != 0) |
                                  (long)iVar4 * (long)iVar3 * 8);
  (this->_pixels)._data = pRVar2;
  *(int *)&(this->_pixels)._sizeX = iVar4;
  *(uint *)((long)&(this->_pixels)._sizeX + 4) = -(uint)(iVar4 < 0);
  *(int *)&(this->_pixels)._sizeY = iVar3;
  *(uint *)((long)&(this->_pixels)._sizeY + 4) = -(uint)(iVar3 < 0);
  this->_type = type;
  (this->_dataWindow).min = dataWindow->min;
  (this->_dataWindow).max = dataWindow->max;
  clear(this);
  return;
}

Assistant:

void
EnvmapImage::resize (Envmap type, const Box2i& dataWindow)
{
    _pixels.resizeEraseUnsafe (
        dataWindow.max.y - dataWindow.min.y + 1,
        dataWindow.max.x - dataWindow.min.x + 1);
    _type       = type;
    _dataWindow = dataWindow;

    clear ();
}